

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void printMemOperandEA(MCInst *MI,int opNum,SStream *O)

{
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  printOperand(MI,opNum,O);
  SStream_concat0(O,", ");
  printOperand(MI,opNum + 1,O);
  return;
}

Assistant:

static void printMemOperandEA(MCInst *MI, int opNum, SStream *O)
{
	// when using stack locations for not load/store instructions
	// print the same way as all normal 3 operand instructions.
	printOperand(MI, opNum, O);
	SStream_concat0(O, ", ");
	printOperand(MI, opNum + 1, O);
	return;
}